

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

lys_module * ly_ctx_get_module_latest_by(ly_ctx *ctx,char *key,size_t key_offset)

{
  uint32_t local_34;
  lys_module *plStack_30;
  uint32_t index;
  lys_module *mod;
  size_t key_offset_local;
  char *key_local;
  ly_ctx *ctx_local;
  
  local_34 = 0;
  mod = (lys_module *)key_offset;
  key_offset_local = (size_t)key;
  key_local = (char *)ctx;
  do {
    plStack_30 = ly_ctx_get_module_by_iter
                           ((ly_ctx *)key_local,(char *)key_offset_local,0,(size_t)mod,&local_34);
    if (plStack_30 == (lys_module *)0x0) {
      return (lys_module *)0x0;
    }
  } while ((plStack_30->latest_revision & 1) == 0);
  return plStack_30;
}

Assistant:

static struct lys_module *
ly_ctx_get_module_latest_by(const struct ly_ctx *ctx, const char *key, size_t key_offset)
{
    struct lys_module *mod;
    uint32_t index = 0;

    while ((mod = ly_ctx_get_module_by_iter(ctx, key, 0, key_offset, &index))) {
        if (mod->latest_revision & LYS_MOD_LATEST_REV) {
            return mod;
        }
    }

    return NULL;
}